

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

fdb_status fdb_free_kvs_name_list(fdb_kvs_name_list *kvs_name_list)

{
  undefined8 *in_RDI;
  fdb_status local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    free((void *)in_RDI[1]);
    in_RDI[1] = 0;
    *in_RDI = 0;
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_free_kvs_name_list(fdb_kvs_name_list *kvs_name_list)
{
    if (!kvs_name_list) {
        return FDB_RESULT_INVALID_ARGS;
    }

    free(kvs_name_list->kvs_names);
    kvs_name_list->kvs_names = NULL;
    kvs_name_list->num_kvs_names = 0;

    return FDB_RESULT_SUCCESS;
}